

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

uint64_t __thiscall
absl::lts_20250127::anon_unknown_0::ShiftRightAndRound
          (anon_unknown_0 *this,uint128 value,int shift,bool input_exact,
          Nonnull<bool_*> output_exact)

{
  uint128 lhs;
  uint128 lhs_00;
  uint128 lhs_01;
  uint128 lhs_02;
  uint128 lhs_03;
  uint128 rhs;
  bool bVar1;
  int amount;
  undefined7 in_register_00000081;
  uint128 uVar2;
  uint128 lhs_04;
  uint128 lhs_05;
  uint128 local_1d8;
  uint64_t local_1c8;
  uint64_t local_1c0;
  uint128 local_1b8;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint128 local_198;
  uint128 local_188;
  anon_unknown_0 *local_178;
  uint64_t local_170;
  uint128 local_168;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  uint128 local_138;
  anon_unknown_0 *local_128;
  uint64_t local_120;
  uint128 local_118;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  anon_unknown_0 *local_d8;
  uint64_t local_d0;
  undefined1 local_c8 [8];
  uint128 shifted_bits;
  undefined8 local_b0;
  uint64_t local_a8;
  uint128 halfway_point;
  uint64_t local_90;
  uint128 local_88;
  uint128 local_78;
  undefined1 local_68 [8];
  uint128 shift_mask;
  uint128 local_48;
  undefined1 *local_38;
  Nonnull<bool_*> output_exact_local;
  undefined1 auStack_28 [3];
  bool input_exact_local;
  int shift_local;
  uint128 value_local;
  unsigned_long local_10;
  
  uVar2.lo_ = value.lo_;
  output_exact_local._4_4_ = (int)value.hi_;
  output_exact_local._3_1_ = (byte)shift & 1;
  local_38 = (undefined1 *)CONCAT71(in_register_00000081,input_exact);
  _auStack_28 = this;
  value_local.lo_ = uVar2.lo_;
  if (output_exact_local._4_4_ < 1) {
    *local_38 = (char)(shift & 0xffffff01U);
    uVar2.hi_._0_4_ = -output_exact_local._4_4_;
    uVar2.hi_._4_4_ = 0;
    shift_mask.hi_ = (uint64_t)this;
    local_48 = lts_20250127::operator<<((lts_20250127 *)this,uVar2,shift & 0xffffff01U);
    local_10 = uint128::operator_cast_to_unsigned_long(&local_48);
  }
  else if (output_exact_local._4_4_ < 0x80) {
    *local_38 = 1;
    uint128::uint128(&local_88,1);
    lhs_04.hi_._0_4_ = output_exact_local._4_4_;
    lhs_04.lo_ = local_88.hi_;
    lhs_04.hi_._4_4_ = 0;
    local_78 = lts_20250127::operator<<((lts_20250127 *)local_88.lo_,lhs_04,shift);
    uint128::uint128((uint128 *)&halfway_point.hi_,1);
    rhs.hi_ = local_90;
    rhs.lo_ = halfway_point.hi_;
    _local_68 = lts_20250127::operator-(local_78,rhs);
    amount = (int)local_90;
    uint128::uint128((uint128 *)&shifted_bits.hi_,1);
    lhs_05.hi_._0_4_ = output_exact_local._4_4_ + -1;
    lhs_05.lo_ = local_b0;
    lhs_05.hi_._4_4_ = 0;
    uVar2 = lts_20250127::operator<<((lts_20250127 *)shifted_bits.hi_,lhs_05,amount);
    local_d8 = _auStack_28;
    local_d0 = value_local.lo_;
    local_e8 = (uint64_t)local_68;
    local_e0 = shift_mask.lo_;
    lhs_03.hi_ = value_local.lo_;
    lhs_03.lo_ = (uint64_t)_auStack_28;
    _local_c8 = operator&(lhs_03,_local_68);
    uint128::operator>>=((uint128 *)auStack_28,output_exact_local._4_4_);
    local_f8 = (uint64_t)local_c8;
    local_f0 = shifted_bits.lo_;
    local_a8 = uVar2.lo_;
    local_108 = local_a8;
    halfway_point.lo_ = uVar2.hi_;
    local_100 = halfway_point.lo_;
    bVar1 = operator>(_local_c8,uVar2);
    if (bVar1) {
      local_128 = _auStack_28;
      local_120 = value_local.lo_;
      uint128::uint128(&local_138,1);
      lhs_02.hi_ = local_120;
      lhs_02.lo_ = (uint64_t)local_128;
      local_118 = lts_20250127::operator+(lhs_02,local_138);
      local_10 = uint128::operator_cast_to_unsigned_long(&local_118);
    }
    else {
      local_148 = (uint64_t)local_c8;
      local_140 = shifted_bits.lo_;
      local_158 = local_a8;
      local_150 = halfway_point.lo_;
      bVar1 = lts_20250127::operator==(_local_c8,uVar2);
      if (bVar1) {
        local_178 = _auStack_28;
        local_170 = value_local.lo_;
        uint128::uint128(&local_188,1);
        lhs_01.hi_ = local_170;
        lhs_01.lo_ = (uint64_t)local_178;
        local_168 = operator&(lhs_01,local_188);
        uint128::uint128(&local_198,1);
        bVar1 = lts_20250127::operator==(local_168,local_198);
        if ((bVar1) || ((output_exact_local._3_1_ & 1) == 0)) {
          uint128::operator++((uint128 *)auStack_28);
        }
        local_10 = uint128::operator_cast_to_unsigned_long((uint128 *)auStack_28);
      }
      else {
        if ((output_exact_local._3_1_ & 1) == 0) {
          local_1a8 = (uint64_t)local_c8;
          local_1a0 = shifted_bits.lo_;
          local_1c8 = local_a8;
          local_1c0 = halfway_point.lo_;
          uint128::uint128(&local_1d8,1);
          lhs.hi_ = local_1c0;
          lhs.lo_ = local_1c8;
          local_1b8 = lts_20250127::operator-(lhs,local_1d8);
          lhs_00.hi_ = local_1a0;
          lhs_00.lo_ = local_1a8;
          bVar1 = lts_20250127::operator==(lhs_00,local_1b8);
          if (bVar1) {
            *local_38 = 0;
          }
        }
        local_10 = uint128::operator_cast_to_unsigned_long((uint128 *)auStack_28);
      }
    }
  }
  else {
    *local_38 = 1;
    local_10 = 0;
  }
  return local_10;
}

Assistant:

uint64_t ShiftRightAndRound(uint128 value, int shift, bool input_exact,
                            absl::Nonnull<bool*> output_exact) {
  if (shift <= 0) {
    *output_exact = input_exact;
    return static_cast<uint64_t>(value << -shift);
  }
  if (shift >= 128) {
    // Exponent is so small that we are shifting away all significant bits.
    // Answer will not be representable, even as a subnormal, so return a zero
    // mantissa (which represents underflow).
    *output_exact = true;
    return 0;
  }

  *output_exact = true;
  const uint128 shift_mask = (uint128(1) << shift) - 1;
  const uint128 halfway_point = uint128(1) << (shift - 1);

  const uint128 shifted_bits = value & shift_mask;
  value >>= shift;
  if (shifted_bits > halfway_point) {
    // Shifted bits greater than 10000... require rounding up.
    return static_cast<uint64_t>(value + 1);
  }
  if (shifted_bits == halfway_point) {
    // In exact mode, shifted bits of 10000... mean we're exactly halfway
    // between two numbers, and we must round to even.  So only round up if
    // the low bit of `value` is set.
    //
    // In inexact mode, the nonzero error means the actual value is greater
    // than the halfway point and we must always round up.
    if ((value & 1) == 1 || !input_exact) {
      ++value;
    }
    return static_cast<uint64_t>(value);
  }
  if (!input_exact && shifted_bits == halfway_point - 1) {
    // Rounding direction is unclear, due to error.
    *output_exact = false;
  }
  // Otherwise, round down.
  return static_cast<uint64_t>(value);
}